

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O3

int __thiscall
libtorrent::aux::part_file::do_hash<libtorrent::lcrypto::hasher256>
          (part_file *this,hasher256 *ph,ptrdiff_t len,piece_index_t piece,int offset,error_code *ec
          )

{
  int iVar1;
  int iVar2;
  __node_base_ptr p_Var3;
  error_code *ec_00;
  span<const_char> data;
  span<char> buf;
  file_handle f;
  vector<char,_std::allocator<char>_> buffer;
  unique_lock<std::mutex> l;
  undefined1 local_74 [8];
  int local_6c;
  vector<char,_std::allocator<char>_> local_68;
  hasher256 *local_50;
  unique_lock<std::mutex> local_48;
  key_type local_34;
  
  local_48._M_device = &this->m_mutex;
  local_48._M_owns = false;
  ec_00 = ec;
  local_6c = offset;
  local_50 = ph;
  local_34.m_val = piece.m_val;
  ::std::unique_lock<std::mutex>::lock(&local_48);
  local_48._M_owns = true;
  p_Var3 = ::std::
           _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_piece_map)._M_h,
                      (ulong)(long)piece.m_val % (this->m_piece_map)._M_h._M_bucket_count,&local_34,
                      (long)piece.m_val);
  if ((p_Var3 == (__node_base_ptr)0x0) || (p_Var3->_M_nxt == (_Hash_node_base *)0x0)) {
    ec->val_ = 2;
    ec->failed_ = true;
    ec->cat_ = &boost::system::detail::cat_holder<void>::generic_category_instance.
                super_error_category;
    iVar2 = -1;
  }
  else {
    iVar1 = *(int *)((long)&p_Var3->_M_nxt[1]._M_nxt + 4);
    open_file((part_file *)local_74,(open_mode_t)(uint)this,(error_code *)0x20);
    iVar2 = -1;
    if (ec->failed_ == false) {
      ::std::unique_lock<std::mutex>::unlock(&local_48);
      ::std::vector<char,_std::allocator<char>_>::vector
                (&local_68,len,(allocator_type *)(local_74 + 7));
      buf.m_ptr = (char *)((long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
      buf.m_len = (long)local_6c + (long)this->m_header_size +
                  (long)this->m_piece_size * (long)iVar1;
      iVar2 = pread_all((aux *)(ulong)(uint)local_74._0_4_,
                        (handle_type)
                        local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,buf,(int64_t)ec,ec_00);
      data.m_len = (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start;
      data.m_ptr = local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
      lcrypto::hasher256::update(local_50,data);
      if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (char *)0x0) {
        operator_delete(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    file_handle::~file_handle((file_handle *)local_74);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_48);
  return iVar2;
}

Assistant:

int part_file::do_hash(Hasher& ph
		, std::ptrdiff_t const len
		, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(len >= 0);
		TORRENT_ASSERT(int(len) + offset <= m_piece_size);
		std::unique_lock<std::mutex> l(m_mutex);

		auto const i = m_piece_map.find(piece);
		if (i == m_piece_map.end())
		{
			ec = error_code(boost::system::errc::no_such_file_or_directory
				, boost::system::generic_category());
			return -1;
		}

		slot_index_t const slot = i->second;
		auto f = open_file(aux::open_mode::read_only | aux::open_mode::hidden, ec);
		if (ec) return -1;

		l.unlock();

		std::vector<char> buffer(static_cast<std::size_t>(len));
		std::int64_t const slot_offset = std::int64_t(m_header_size) + std::int64_t(static_cast<int>(slot)) * m_piece_size;
		int const ret = int(aux::pread_all(f.fd(), buffer, slot_offset + offset, ec));
		ph.update(buffer);
		return ret;
	}